

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_api.c
# Opt level: O1

MPP_RET h263d_parse(void *dec,HalDecTask *task)

{
  MPP_RET MVar1;
  
  if (dec == (void *)0x0 || task == (HalDecTask *)0x0) {
    _mpp_log_l(2,"h263d_api","found NULL intput dec %p task %p\n","h263d_parse",dec,task);
    MVar1 = MPP_ERR_NULL_PTR;
  }
  else {
    MVar1 = mpp_h263_parser_decode(*(H263dParser *)((long)dec + 0x40),task->input_packet);
    if (MVar1 == MPP_OK) {
      mpp_h263_parser_setup_syntax(*(H263dParser *)((long)dec + 0x40),&task->syntax);
      mpp_h263_parser_setup_hal_output(*(H263dParser *)((long)dec + 0x40),&task->output);
      mpp_h263_parser_setup_refer(*(H263dParser *)((long)dec + 0x40),task->refer,0x11);
      mpp_h263_parser_update_dpb(*(H263dParser *)((long)dec + 0x40));
      *(int *)((long)dec + 0x3c) = *(int *)((long)dec + 0x3c) + 1;
      MVar1 = MPP_OK;
    }
    else {
      task->valid = 0;
      task->output = -1;
      mpp_packet_set_length(task->input_packet,0);
      MVar1 = MPP_NOK;
    }
  }
  return MVar1;
}

Assistant:

MPP_RET h263d_parse(void *dec, HalDecTask *task)
{
    MPP_RET ret;
    H263dCtx *p;

    if (NULL == dec || NULL == task) {
        mpp_err_f("found NULL intput dec %p task %p\n", dec, task);
        return MPP_ERR_NULL_PTR;
    }
    p = (H263dCtx *)dec;
    ret = mpp_h263_parser_decode(p->parser, task->input_packet);
    if (ret) {
        // found error on decoding drop this task and clear remaining length
        task->valid  = 0;
        task->output = -1;
        mpp_packet_set_length(task->input_packet, 0);
        return MPP_NOK;
    }

    mpp_h263_parser_setup_syntax(p->parser, &task->syntax);
    mpp_h263_parser_setup_hal_output(p->parser, &task->output);
    mpp_h263_parser_setup_refer(p->parser, task->refer, MAX_DEC_REF_NUM);
    mpp_h263_parser_update_dpb(p->parser);

    p->frame_count++;

    return MPP_OK;
}